

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_logger.cpp
# Opt level: O2

void __thiscall duckdb::SQLLogicTestLogger::PrintSQLFormatted(SQLLogicTestLogger *this)

{
  SimplifiedTokenType SVar1;
  ostream *poVar2;
  ostream *stream;
  reference pvVar3;
  ulong __n;
  vector<duckdb::SimplifiedToken,_true> tokens;
  long local_70;
  long local_68;
  string *local_58;
  string local_50 [32];
  
  poVar2 = termcolor::bold((ostream *)&std::cerr);
  stream = std::operator<<((ostream *)poVar2,"SQL Query");
  poVar2 = termcolor::reset((ostream *)stream);
  std::endl<char,std::char_traits<char>>((ostream *)poVar2);
  local_58 = &this->sql_query;
  duckdb::Parser::Tokenize((string *)&local_70);
  __n = 0;
  while (__n < (ulong)(local_68 - local_70 >> 4)) {
    pvVar3 = vector<duckdb::SimplifiedToken,_true>::get<true>
                       ((vector<duckdb::SimplifiedToken,_true> *)&local_70,__n);
    __n = __n + 1;
    if (__n < (ulong)(local_68 - local_70 >> 4)) {
      vector<duckdb::SimplifiedToken,_true>::get<true>
                ((vector<duckdb::SimplifiedToken,_true> *)&local_70,__n);
    }
    SVar1 = pvVar3->type;
    if (SVar1 - 1 < 2) {
      termcolor::yellow((ostream *)&std::cerr);
    }
    else if (SVar1 == SIMPLIFIED_TOKEN_KEYWORD) {
      poVar2 = termcolor::green((ostream *)&std::cerr);
      termcolor::bold(poVar2);
    }
    else if (SVar1 == SIMPLIFIED_TOKEN_COMMENT) {
      termcolor::grey((ostream *)&std::cerr);
    }
    std::__cxx11::string::substr((ulong)local_50,(ulong)local_58);
    std::operator<<((ostream *)&std::cerr,local_50);
    std::__cxx11::string::~string(local_50);
    termcolor::reset((ostream *)&std::cerr);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  std::_Vector_base<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_>::
  ~_Vector_base((_Vector_base<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_> *)
                &local_70);
  return;
}

Assistant:

void SQLLogicTestLogger::PrintSQLFormatted() {
	std::cerr << termcolor::bold << "SQL Query" << termcolor::reset << std::endl;
	auto tokens = Parser::Tokenize(sql_query);
	for (idx_t i = 0; i < tokens.size(); i++) {
		auto &token = tokens[i];
		idx_t next = i + 1 < tokens.size() ? tokens[i + 1].start : sql_query.size();
		// adjust the highlighting based on the type
		switch (token.type) {
		case SimplifiedTokenType::SIMPLIFIED_TOKEN_IDENTIFIER:
		case SimplifiedTokenType::SIMPLIFIED_TOKEN_ERROR:
			break;
		case SimplifiedTokenType::SIMPLIFIED_TOKEN_NUMERIC_CONSTANT:
		case SimplifiedTokenType::SIMPLIFIED_TOKEN_STRING_CONSTANT:
			std::cerr << termcolor::yellow;
			break;
		case SimplifiedTokenType::SIMPLIFIED_TOKEN_OPERATOR:
			break;
		case SimplifiedTokenType::SIMPLIFIED_TOKEN_KEYWORD:
			std::cerr << termcolor::green << termcolor::bold;
			break;
		case SimplifiedTokenType::SIMPLIFIED_TOKEN_COMMENT:
			std::cerr << termcolor::grey;
			break;
		}
		// print the current token
		std::cerr << sql_query.substr(token.start, next - token.start);
		// reset and move to the next token
		std::cerr << termcolor::reset;
	}
	std::cerr << std::endl;
}